

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 float128_to_floatx80_mipsel(float128 a,float_status *status)

{
  commonNaNT a_00;
  undefined8 uVar1;
  uint uVar2;
  floatx80 fVar3;
  int32_t aExp;
  uint64_t aSig0;
  uint64_t aSig1;
  uint local_3c;
  ulong local_38;
  uint64_t local_30;
  commonNaNT local_28;
  
  local_30 = a.low;
  local_38 = a.high & 0xffffffffffff;
  local_3c = a.high._6_2_ & 0x7fff;
  uVar2 = a.high._4_4_ >> 0x1f;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_30 != 0) {
      normalizeFloat128Subnormal(local_38,local_30,(int32_t *)&local_3c,&local_38,&local_30);
      goto LAB_007ce7c5;
    }
    uVar2 = uVar2 << 0xf;
    uVar1 = 0;
  }
  else {
    if (local_3c != 0x7fff) {
      local_38 = local_38 + 0x1000000000000;
LAB_007ce7c5:
      local_38 = local_38 << 0xf | local_30 >> 0x31;
      local_30 = local_30 << 0xf;
      fVar3 = roundAndPackFloatx80_mipsel('P',a.high._7_1_ >> 7,local_3c,local_38,local_30,status);
      return fVar3;
    }
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_30 != 0) {
      float128ToCommonNaN(&local_28,a,status);
      a_00.high = local_28.high;
      a_00.sign = local_28.sign;
      a_00._1_7_ = local_28._1_7_;
      a_00.low = local_28.low;
      fVar3 = commonNaNToFloatx80(a_00,status);
      return fVar3;
    }
    uVar2 = uVar2 << 0xf | 0x7fff;
    uVar1 = 0x8000000000000000;
  }
  fVar3._8_4_ = uVar2;
  fVar3.low = uVar1;
  fVar3._12_4_ = 0;
  return fVar3;
}

Assistant:

floatx80 float128_to_floatx80(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig0, aSig1;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( aSig0 | aSig1 ) {
            return commonNaNToFloatx80(float128ToCommonNaN(a, status), status);
        }
        return packFloatx80(aSign, floatx80_infinity_high,
                                   floatx80_infinity_low);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloatx80( aSign, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    else {
        aSig0 |= UINT64_C(0x0001000000000000);
    }
    shortShift128Left( aSig0, aSig1, 15, &aSig0, &aSig1 );
    return roundAndPackFloatx80(80, aSign, aExp, aSig0, aSig1, status);

}